

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbinflow.cpp
# Opt level: O0

int __thiscall pele::physics::turbinflow::TurbInflow::init(TurbInflow *this,EVP_PKEY_CTX *ctx)

{
  double dVar1;
  value_type_conflict1 vVar2;
  int j;
  bool bVar3;
  byte bVar4;
  int iVar5;
  int extraout_EAX;
  TurbParm *pTVar6;
  long lVar7;
  Long LVar8;
  double *pdVar9;
  char *pcVar10;
  reference pvVar11;
  void *pvVar12;
  reference pvVar13;
  FArrayBox *pFVar14;
  int i_1;
  Real rdummy;
  int i;
  Box sbx;
  int idim_1;
  Array<int,_3> iper;
  Array<amrex::Real,_3> probsize;
  Array<int,_3> npts;
  ifstream is;
  string turb_header;
  int idim;
  Vector<double,_std::allocator<double>_> turb_center;
  string side;
  ParmParse pp;
  int n_1;
  int n;
  Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tp_list;
  int n_tp;
  ParmParse ppr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff768;
  Print *in_stack_fffffffffffff770;
  string *in_stack_fffffffffffff778;
  ParmParse *in_stack_fffffffffffff780;
  size_type in_stack_fffffffffffff788;
  Vector<long,_std::allocator<long>_> *__new_size;
  int in_stack_fffffffffffff790;
  value_type in_stack_fffffffffffff794;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff798;
  Print *in_stack_fffffffffffff7a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff7b0;
  char *in_stack_fffffffffffff7b8;
  undefined8 in_stack_fffffffffffff7d8;
  undefined4 in_stack_fffffffffffff7e0;
  value_type in_stack_fffffffffffff7e4;
  char *in_stack_fffffffffffff7e8;
  ParmParse *in_stack_fffffffffffff7f0;
  char *in_stack_fffffffffffff7f8;
  ParmParse *in_stack_fffffffffffff800;
  char *in_stack_fffffffffffff808;
  ParmParse *in_stack_fffffffffffff810;
  int local_6d4;
  double local_6d0;
  int local_6c4;
  IntVect local_6c0;
  IntVect local_6b4 [3];
  int local_68c;
  undefined8 local_688;
  undefined4 local_680;
  undefined8 local_678;
  undefined8 uStack_670;
  undefined8 local_668;
  undefined8 local_660;
  undefined4 local_658;
  string local_650 [32];
  undefined1 local_630 [520];
  string local_428 [32];
  int local_408;
  undefined8 local_400;
  char local_3f8 [416];
  string local_258 [32];
  string local_238 [120];
  int local_1c0;
  int local_1bc;
  int local_1a0;
  string local_190 [120];
  EVP_PKEY_CTX *local_118;
  TurbInflow *local_110;
  char *local_108;
  undefined4 local_fc;
  GpuArray<double,_3U> *local_f8;
  undefined4 local_ec;
  GpuArray<double,_3U> *local_e8;
  undefined4 local_dc;
  GpuArray<double,_3U> *local_d8;
  undefined4 local_cc;
  GpuArray<double,_3U> *local_c8;
  undefined4 local_bc;
  GpuArray<double,_3U> *local_b8;
  undefined4 local_ac;
  GpuArray<double,_3U> *local_a8;
  undefined4 local_9c;
  GpuArray<double,_3U> *local_98;
  undefined4 local_8c;
  GpuArray<double,_3U> *local_88;
  undefined4 local_7c;
  GpuArray<double,_3U> *local_78;
  undefined4 local_6c;
  GpuArray<double,_3U> *local_68;
  int local_5c;
  GpuArray<double,_3U> *local_58;
  int local_4c;
  GpuArray<double,_3U> *local_48;
  int local_3c;
  GpuArray<double,_3U> *local_38;
  undefined4 local_2c;
  GpuArray<int,_3U> *local_28;
  undefined4 local_1c;
  GpuArray<int,_3U> *local_18;
  undefined4 local_c;
  GpuArray<int,_3U> *local_8;
  
  local_118 = ctx;
  local_110 = this;
  std::__cxx11::string::string(local_190);
  amrex::ParmParse::ParmParse(in_stack_fffffffffffff780,in_stack_fffffffffffff778);
  std::__cxx11::string::~string(local_190);
  local_1a0 = 0;
  local_1a0 = amrex::ParmParse::countval
                        (in_stack_fffffffffffff810,in_stack_fffffffffffff808,
                         (int)((ulong)in_stack_fffffffffffff800 >> 0x20));
  amrex::
  Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::Vector((Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0xe37068);
  if (0 < local_1a0) {
    std::
    vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
    ::resize((vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
              *)CONCAT44(in_stack_fffffffffffff794,in_stack_fffffffffffff790),
             in_stack_fffffffffffff788);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::resize((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)CONCAT44(in_stack_fffffffffffff794,in_stack_fffffffffffff790),
             in_stack_fffffffffffff788);
    for (local_1bc = 0; local_1bc < local_1a0; local_1bc = local_1bc + 1) {
      amrex::
      Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[]((Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_fffffffffffff770,(size_type)in_stack_fffffffffffff768);
      amrex::ParmParse::get
                (in_stack_fffffffffffff7f0,in_stack_fffffffffffff7e8,
                 (string *)CONCAT44(in_stack_fffffffffffff7e4,in_stack_fffffffffffff7e0),
                 (int)((ulong)in_stack_fffffffffffff7d8 >> 0x20));
    }
  }
  for (local_1c0 = 0; local_1c0 < local_1a0; local_1c0 = local_1c0 + 1) {
    amrex::
    Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[]((Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_fffffffffffff770,(size_type)in_stack_fffffffffffff768);
    std::operator+(in_stack_fffffffffffff7b8,in_stack_fffffffffffff7b0);
    amrex::ParmParse::ParmParse(in_stack_fffffffffffff780,in_stack_fffffffffffff778);
    std::__cxx11::string::~string(local_238);
    iVar5 = amrex::ParmParse::countval
                      (in_stack_fffffffffffff810,in_stack_fffffffffffff808,
                       (int)((ulong)in_stack_fffffffffffff800 >> 0x20));
    if (0 < iVar5) {
      amrex::
      Vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
      ::operator[]((Vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                    *)in_stack_fffffffffffff770,(size_type)in_stack_fffffffffffff768);
      amrex::ParmParse::query
                (in_stack_fffffffffffff800,in_stack_fffffffffffff7f8,
                 (string *)in_stack_fffffffffffff7f0,(int)((ulong)in_stack_fffffffffffff7e8 >> 0x20)
                );
      pTVar6 = amrex::
               Vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
               ::operator[]((Vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                             *)in_stack_fffffffffffff770,(size_type)in_stack_fffffffffffff768);
      pTVar6->dir = -1;
      amrex::
      Vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
      ::operator[]((Vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                    *)in_stack_fffffffffffff770,(size_type)in_stack_fffffffffffff768);
      amrex::ParmParse::query
                (in_stack_fffffffffffff800,in_stack_fffffffffffff7f8,
                 (int *)in_stack_fffffffffffff7f0,(int)((ulong)in_stack_fffffffffffff7e8 >> 0x20));
      std::__cxx11::string::string(local_258);
      amrex::ParmParse::query
                (in_stack_fffffffffffff800,in_stack_fffffffffffff7f8,
                 (string *)in_stack_fffffffffffff7f0,(int)((ulong)in_stack_fffffffffffff7e8 >> 0x20)
                );
      bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffff770,(char *)in_stack_fffffffffffff768);
      if (bVar3) {
        pTVar6 = amrex::
                 Vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                 ::operator[]((Vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                               *)in_stack_fffffffffffff770,(size_type)in_stack_fffffffffffff768);
        pTVar6->side = low;
      }
      else {
        bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_fffffffffffff770,(char *)in_stack_fffffffffffff768);
        if (bVar3) {
          pTVar6 = amrex::
                   Vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                   ::operator[]((Vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                                 *)in_stack_fffffffffffff770,(size_type)in_stack_fffffffffffff768);
          pTVar6->side = high;
        }
        else {
          local_108 = "turbinflow.side can only be low or high";
          amrex::Abort_host((char *)in_stack_fffffffffffff780);
        }
      }
      amrex::
      Vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
      ::operator[]((Vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                    *)in_stack_fffffffffffff770,(size_type)in_stack_fffffffffffff768);
      amrex::ParmParse::query
                (in_stack_fffffffffffff800,in_stack_fffffffffffff7f8,
                 (double *)in_stack_fffffffffffff7f0,(int)((ulong)in_stack_fffffffffffff7e8 >> 0x20)
                );
      amrex::
      Vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
      ::operator[]((Vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                    *)in_stack_fffffffffffff770,(size_type)in_stack_fffffffffffff768);
      amrex::ParmParse::query
                (in_stack_fffffffffffff800,in_stack_fffffffffffff7f8,
                 (double *)in_stack_fffffffffffff7f0,(int)((ulong)in_stack_fffffffffffff7e8 >> 0x20)
                );
      amrex::
      Vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
      ::operator[]((Vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                    *)in_stack_fffffffffffff770,(size_type)in_stack_fffffffffffff768);
      amrex::ParmParse::query
                (in_stack_fffffffffffff800,in_stack_fffffffffffff7f8,
                 (double *)in_stack_fffffffffffff7f0,(int)((ulong)in_stack_fffffffffffff7e8 >> 0x20)
                );
      amrex::OutStream();
      amrex::Print::Print(in_stack_fffffffffffff7a0,(ostream *)in_stack_fffffffffffff798);
      amrex::Print::operator<<(in_stack_fffffffffffff770,(char (*) [25])in_stack_fffffffffffff768);
      amrex::
      Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[]((Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_fffffffffffff770,(size_type)in_stack_fffffffffffff768);
      amrex::Print::operator<<(in_stack_fffffffffffff770,in_stack_fffffffffffff768);
      amrex::Print::operator<<(in_stack_fffffffffffff770,(char (*) [12])in_stack_fffffffffffff768);
      amrex::
      Vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
      ::operator[]((Vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                    *)in_stack_fffffffffffff770,(size_type)in_stack_fffffffffffff768);
      amrex::Print::operator<<(in_stack_fffffffffffff770,in_stack_fffffffffffff768);
      amrex::Print::operator<<(in_stack_fffffffffffff770,(char (*) [45])in_stack_fffffffffffff768);
      amrex::
      Vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
      ::operator[]((Vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                    *)in_stack_fffffffffffff770,(size_type)in_stack_fffffffffffff768);
      amrex::Print::operator<<(in_stack_fffffffffffff770,(double *)in_stack_fffffffffffff768);
      amrex::Print::operator<<(in_stack_fffffffffffff770,(char (*) [35])in_stack_fffffffffffff768);
      amrex::
      Vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
      ::operator[]((Vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                    *)in_stack_fffffffffffff770,(size_type)in_stack_fffffffffffff768);
      amrex::Print::operator<<(in_stack_fffffffffffff770,(double *)in_stack_fffffffffffff768);
      amrex::Print::operator<<(in_stack_fffffffffffff770,(char (*) [4])in_stack_fffffffffffff768);
      amrex::Print::~Print((Print *)CONCAT44(in_stack_fffffffffffff7e4,in_stack_fffffffffffff7e0));
      local_400 = 0;
      std::allocator<double>::allocator((allocator<double> *)0xe3762b);
      amrex::Vector<double,_std::allocator<double>_>::vector
                ((Vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff780,
                 (size_type)in_stack_fffffffffffff778,
                 (value_type_conflict1 *)in_stack_fffffffffffff770,
                 (allocator_type *)in_stack_fffffffffffff768);
      std::allocator<double>::~allocator((allocator<double> *)0xe3765c);
      amrex::ParmParse::getarr
                (in_stack_fffffffffffff7f0,in_stack_fffffffffffff7e8,
                 (vector<double,_std::allocator<double>_> *)
                 CONCAT44(in_stack_fffffffffffff7e4,in_stack_fffffffffffff7e0),
                 (int)((ulong)in_stack_fffffffffffff7d8 >> 0x20),(int)in_stack_fffffffffffff7d8);
      local_408 = 0;
      while( true ) {
        lVar7 = (long)local_408;
        LVar8 = amrex::Vector<double,_std::allocator<double>_>::size
                          ((Vector<double,_std::allocator<double>_> *)0xe376aa);
        iVar5 = (int)((ulong)in_stack_fffffffffffff7e8 >> 0x20);
        if (LVar8 <= lVar7) break;
        pTVar6 = amrex::
                 Vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                 ::operator[]((Vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                               *)in_stack_fffffffffffff770,(size_type)in_stack_fffffffffffff768);
        dVar1 = pTVar6->turb_scale_loc;
        pdVar9 = amrex::Vector<double,_std::allocator<double>_>::operator[]
                           ((Vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff770,
                            (size_type)in_stack_fffffffffffff768);
        *pdVar9 = dVar1 * *pdVar9;
        local_408 = local_408 + 1;
      }
      amrex::
      Vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
      ::operator[]((Vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                    *)in_stack_fffffffffffff770,(size_type)in_stack_fffffffffffff768);
      amrex::ParmParse::query
                (in_stack_fffffffffffff800,in_stack_fffffffffffff7f8,
                 (int *)in_stack_fffffffffffff7f0,iVar5);
      amrex::
      Vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
      ::operator[]((Vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                    *)in_stack_fffffffffffff770,(size_type)in_stack_fffffffffffff768);
      amrex::ParmParse::query
                (in_stack_fffffffffffff800,in_stack_fffffffffffff7f8,
                 (double *)in_stack_fffffffffffff7f0,iVar5);
      amrex::
      Vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
      ::operator[]((Vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                    *)in_stack_fffffffffffff770,(size_type)in_stack_fffffffffffff768);
      std::operator+(in_stack_fffffffffffff798,
                     (char *)CONCAT44(in_stack_fffffffffffff794,in_stack_fffffffffffff790));
      pcVar10 = (char *)std::__cxx11::string::c_str();
      std::ifstream::ifstream(local_630,pcVar10,_S_in);
      bVar4 = std::ifstream::is_open();
      if ((bVar4 & 1) == 0) {
        std::operator+(in_stack_fffffffffffff7b8,in_stack_fffffffffffff7b0);
        amrex::Abort(in_stack_fffffffffffff768);
        std::__cxx11::string::~string(local_650);
      }
      local_658 = 0;
      local_660 = 0;
      local_678 = 0;
      uStack_670 = 0;
      local_668 = 0;
      local_680 = 0;
      local_688 = 0;
      pvVar11 = std::array<int,_3UL>::operator[]
                          ((array<int,_3UL> *)in_stack_fffffffffffff770,
                           (size_type)in_stack_fffffffffffff768);
      pvVar12 = (void *)std::istream::operator>>(local_630,pvVar11);
      pvVar11 = std::array<int,_3UL>::operator[]
                          ((array<int,_3UL> *)in_stack_fffffffffffff770,
                           (size_type)in_stack_fffffffffffff768);
      pvVar12 = (void *)std::istream::operator>>(pvVar12,pvVar11);
      pvVar11 = std::array<int,_3UL>::operator[]
                          ((array<int,_3UL> *)in_stack_fffffffffffff770,
                           (size_type)in_stack_fffffffffffff768);
      std::istream::operator>>(pvVar12,pvVar11);
      pvVar13 = std::array<double,_3UL>::operator[]
                          ((array<double,_3UL> *)in_stack_fffffffffffff770,
                           (size_type)in_stack_fffffffffffff768);
      pvVar12 = (void *)std::istream::operator>>(local_630,pvVar13);
      pvVar13 = std::array<double,_3UL>::operator[]
                          ((array<double,_3UL> *)in_stack_fffffffffffff770,
                           (size_type)in_stack_fffffffffffff768);
      pvVar12 = (void *)std::istream::operator>>(pvVar12,pvVar13);
      pvVar13 = std::array<double,_3UL>::operator[]
                          ((array<double,_3UL> *)in_stack_fffffffffffff770,
                           (size_type)in_stack_fffffffffffff768);
      std::istream::operator>>(pvVar12,pvVar13);
      pvVar11 = std::array<int,_3UL>::operator[]
                          ((array<int,_3UL> *)in_stack_fffffffffffff770,
                           (size_type)in_stack_fffffffffffff768);
      pvVar12 = (void *)std::istream::operator>>(local_630,pvVar11);
      pvVar11 = std::array<int,_3UL>::operator[]
                          ((array<int,_3UL> *)in_stack_fffffffffffff770,
                           (size_type)in_stack_fffffffffffff768);
      pvVar12 = (void *)std::istream::operator>>(pvVar12,pvVar11);
      pvVar11 = std::array<int,_3UL>::operator[]
                          ((array<int,_3UL> *)in_stack_fffffffffffff770,
                           (size_type)in_stack_fffffffffffff768);
      std::istream::operator>>(pvVar12,pvVar11);
      for (local_68c = 0; local_68c < 3; local_68c = local_68c + 1) {
        pvVar13 = std::array<double,_3UL>::operator[]
                            ((array<double,_3UL> *)in_stack_fffffffffffff770,
                             (size_type)in_stack_fffffffffffff768);
        dVar1 = *pvVar13;
        pvVar11 = std::array<int,_3UL>::operator[]
                            ((array<int,_3UL> *)in_stack_fffffffffffff770,
                             (size_type)in_stack_fffffffffffff768);
        iVar5 = *pvVar11;
        pTVar6 = amrex::
                 Vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                 ::operator[]((Vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                               *)in_stack_fffffffffffff770,(size_type)in_stack_fffffffffffff768);
        local_38 = &pTVar6->dx;
        local_3c = local_68c;
        local_38->arr[local_68c] = dVar1 / (double)(iVar5 + -1);
        pTVar6 = amrex::
                 Vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                 ::operator[]((Vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                               *)in_stack_fffffffffffff770,(size_type)in_stack_fffffffffffff768);
        local_48 = &pTVar6->dx;
        local_4c = local_68c;
        dVar1 = local_48->arr[local_68c];
        pTVar6 = amrex::
                 Vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                 ::operator[]((Vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                               *)in_stack_fffffffffffff770,(size_type)in_stack_fffffffffffff768);
        local_58 = &pTVar6->dxinv;
        local_5c = local_68c;
        local_58->arr[local_68c] = 1.0 / dVar1;
      }
      pvVar13 = std::array<double,_3UL>::operator[]
                          ((array<double,_3UL> *)in_stack_fffffffffffff770,
                           (size_type)in_stack_fffffffffffff768);
      in_stack_fffffffffffff7a0 = (Print *)*pvVar13;
      pTVar6 = amrex::
               Vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
               ::operator[]((Vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                             *)in_stack_fffffffffffff770,(size_type)in_stack_fffffffffffff768);
      local_68 = &pTVar6->dx;
      local_6c = 0;
      dVar1 = (double)in_stack_fffffffffffff7a0 - (local_68->arr[0] + local_68->arr[0]);
      pTVar6 = amrex::
               Vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
               ::operator[]((Vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                             *)in_stack_fffffffffffff770,(size_type)in_stack_fffffffffffff768);
      local_78 = &pTVar6->pboxsize;
      local_7c = 0;
      local_78->arr[0] = dVar1;
      pvVar13 = std::array<double,_3UL>::operator[]
                          ((array<double,_3UL> *)in_stack_fffffffffffff770,
                           (size_type)in_stack_fffffffffffff768);
      in_stack_fffffffffffff7b0 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*pvVar13;
      pTVar6 = amrex::
               Vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
               ::operator[]((Vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                             *)in_stack_fffffffffffff770,(size_type)in_stack_fffffffffffff768);
      local_88 = &pTVar6->dx;
      local_8c = 1;
      dVar1 = (pTVar6->dx).arr[1];
      in_stack_fffffffffffff7b8 = (char *)((double)in_stack_fffffffffffff7b0 - (dVar1 + dVar1));
      pTVar6 = amrex::
               Vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
               ::operator[]((Vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                             *)in_stack_fffffffffffff770,(size_type)in_stack_fffffffffffff768);
      local_98 = &pTVar6->pboxsize;
      local_9c = 1;
      (pTVar6->pboxsize).arr[1] = (double)in_stack_fffffffffffff7b8;
      in_stack_fffffffffffff7d8 = 2;
      pvVar13 = std::array<double,_3UL>::operator[]
                          ((array<double,_3UL> *)in_stack_fffffffffffff770,
                           (size_type)in_stack_fffffffffffff768);
      vVar2 = *pvVar13;
      pTVar6 = amrex::
               Vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
               ::operator[]((Vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                             *)in_stack_fffffffffffff770,(size_type)in_stack_fffffffffffff768);
      local_a8 = &pTVar6->pboxsize;
      local_ac = 2;
      (pTVar6->pboxsize).arr[2] = vVar2;
      pvVar11 = std::array<int,_3UL>::operator[]
                          ((array<int,_3UL> *)in_stack_fffffffffffff770,
                           (size_type)in_stack_fffffffffffff768);
      iVar5 = *pvVar11;
      pTVar6 = amrex::
               Vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
               ::operator[]((Vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                             *)in_stack_fffffffffffff770,(size_type)in_stack_fffffffffffff768);
      local_8 = &pTVar6->npboxcells;
      local_c = 0;
      local_8->arr[0] = iVar5 + -3;
      pvVar11 = std::array<int,_3UL>::operator[]
                          ((array<int,_3UL> *)in_stack_fffffffffffff770,
                           (size_type)in_stack_fffffffffffff768);
      iVar5 = *pvVar11;
      pTVar6 = amrex::
               Vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
               ::operator[]((Vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                             *)in_stack_fffffffffffff770,(size_type)in_stack_fffffffffffff768);
      local_18 = &pTVar6->npboxcells;
      local_1c = 1;
      (pTVar6->npboxcells).arr[1] = iVar5 + -3;
      pvVar11 = std::array<int,_3UL>::operator[]
                          ((array<int,_3UL> *)in_stack_fffffffffffff770,
                           (size_type)in_stack_fffffffffffff768);
      in_stack_fffffffffffff7e4 = *pvVar11;
      pTVar6 = amrex::
               Vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
               ::operator[]((Vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                             *)in_stack_fffffffffffff770,(size_type)in_stack_fffffffffffff768);
      local_28 = &pTVar6->npboxcells;
      local_2c = 2;
      (pTVar6->npboxcells).arr[2] = in_stack_fffffffffffff7e4;
      in_stack_fffffffffffff7f8 = local_3f8;
      pdVar9 = amrex::Vector<double,_std::allocator<double>_>::operator[]
                         ((Vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff770,
                          (size_type)in_stack_fffffffffffff768);
      in_stack_fffffffffffff7e8 = (char *)*pdVar9;
      pTVar6 = amrex::
               Vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
               ::operator[]((Vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                             *)in_stack_fffffffffffff770,(size_type)in_stack_fffffffffffff768);
      local_b8 = &pTVar6->pboxsize;
      local_bc = 0;
      in_stack_fffffffffffff800 = (ParmParse *)0xbfe0000000000000;
      in_stack_fffffffffffff7f0 =
           (ParmParse *)(local_b8->arr[0] * -0.5 + (double)in_stack_fffffffffffff7e8);
      pTVar6 = amrex::
               Vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
               ::operator[]((Vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                             *)in_stack_fffffffffffff770,(size_type)in_stack_fffffffffffff768);
      local_c8 = &pTVar6->pboxlo;
      local_cc = 0;
      local_c8->arr[0] = (double)in_stack_fffffffffffff7f0;
      pdVar9 = amrex::Vector<double,_std::allocator<double>_>::operator[]
                         ((Vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff770,
                          (size_type)in_stack_fffffffffffff768);
      in_stack_fffffffffffff808 = (char *)*pdVar9;
      pTVar6 = amrex::
               Vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
               ::operator[]((Vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                             *)in_stack_fffffffffffff770,(size_type)in_stack_fffffffffffff768);
      local_d8 = &pTVar6->pboxsize;
      local_dc = 1;
      in_stack_fffffffffffff810 =
           (ParmParse *)
           ((pTVar6->pboxsize).arr[1] * (double)in_stack_fffffffffffff800 +
           (double)in_stack_fffffffffffff808);
      pTVar6 = amrex::
               Vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
               ::operator[]((Vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                             *)in_stack_fffffffffffff770,(size_type)in_stack_fffffffffffff768);
      local_e8 = &pTVar6->pboxlo;
      local_ec = 1;
      (pTVar6->pboxlo).arr[1] = (double)in_stack_fffffffffffff810;
      pTVar6 = amrex::
               Vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
               ::operator[]((Vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                             *)in_stack_fffffffffffff770,(size_type)in_stack_fffffffffffff768);
      local_f8 = &pTVar6->pboxlo;
      local_fc = 2;
      (pTVar6->pboxlo).arr[2] = 0.0;
      amrex::IntVect::IntVect(local_6b4,1,1,1);
      pvVar11 = std::array<int,_3UL>::operator[]
                          ((array<int,_3UL> *)in_stack_fffffffffffff770,
                           (size_type)in_stack_fffffffffffff768);
      iVar5 = *pvVar11;
      pvVar11 = std::array<int,_3UL>::operator[]
                          ((array<int,_3UL> *)in_stack_fffffffffffff770,
                           (size_type)in_stack_fffffffffffff768);
      j = *pvVar11;
      pTVar6 = amrex::
               Vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
               ::operator[]((Vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                             *)in_stack_fffffffffffff770,(size_type)in_stack_fffffffffffff768);
      amrex::IntVect::IntVect(&local_6c0,iVar5,j,pTVar6->nplane);
      amrex::Box::Box((Box *)in_stack_fffffffffffff770,(IntVect *)in_stack_fffffffffffff768,
                      (IntVect *)0xe381e7);
      pFVar14 = (FArrayBox *)operator_new(0x48);
      in_stack_fffffffffffff798 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           amrex::The_Async_Arena();
      amrex::FArrayBox::FArrayBox
                ((FArrayBox *)in_stack_fffffffffffff780,(Box *)in_stack_fffffffffffff778,
                 (int)((ulong)in_stack_fffffffffffff770 >> 0x20),(Arena *)in_stack_fffffffffffff768)
      ;
      pTVar6 = amrex::
               Vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
               ::operator[]((Vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                             *)in_stack_fffffffffffff770,(size_type)in_stack_fffffffffffff768);
      pTVar6->sdata = pFVar14;
      pvVar11 = std::array<int,_3UL>::operator[]
                          ((array<int,_3UL> *)in_stack_fffffffffffff770,
                           (size_type)in_stack_fffffffffffff768);
      in_stack_fffffffffffff794 = *pvVar11;
      pTVar6 = amrex::
               Vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
               ::operator[]((Vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                             *)in_stack_fffffffffffff770,(size_type)in_stack_fffffffffffff768);
      pTVar6->kmax = in_stack_fffffffffffff794;
      pTVar6 = amrex::
               Vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
               ::operator[]((Vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                             *)in_stack_fffffffffffff770,(size_type)in_stack_fffffffffffff768);
      if ((pTVar6->isswirltype & 1U) != 0) {
        local_6c4 = 0;
        while (in_stack_fffffffffffff790 = local_6c4,
              pTVar6 = amrex::
                       Vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                       ::operator[]((Vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                                     *)in_stack_fffffffffffff770,
                                    (size_type)in_stack_fffffffffffff768),
              in_stack_fffffffffffff790 < pTVar6->kmax) {
          local_6d0 = 0.0;
          std::istream::operator>>(local_630,&local_6d0);
          local_6c4 = local_6c4 + 1;
        }
      }
      pTVar6 = amrex::
               Vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
               ::operator[]((Vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                             *)in_stack_fffffffffffff770,(size_type)in_stack_fffffffffffff768);
      __new_size = &pTVar6->m_offset;
      amrex::
      Vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
      ::operator[]((Vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                    *)in_stack_fffffffffffff770,(size_type)in_stack_fffffffffffff768);
      std::vector<long,_std::allocator<long>_>::resize
                ((vector<long,_std::allocator<long>_> *)
                 CONCAT44(in_stack_fffffffffffff794,in_stack_fffffffffffff790),(size_type)__new_size
                );
      amrex::
      Vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
      ::operator[]((Vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                    *)in_stack_fffffffffffff770,(size_type)in_stack_fffffffffffff768);
      in_stack_fffffffffffff778 =
           (string *)
           std::vector<long,_std::allocator<long>_>::data
                     ((vector<long,_std::allocator<long>_> *)0xe383b7);
      pTVar6 = amrex::
               Vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
               ::operator[]((Vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                             *)in_stack_fffffffffffff770,(size_type)in_stack_fffffffffffff768);
      pTVar6->offset = (long *)in_stack_fffffffffffff778;
      amrex::
      Vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
      ::operator[]((Vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                    *)in_stack_fffffffffffff770,(size_type)in_stack_fffffffffffff768);
      in_stack_fffffffffffff780 =
           (ParmParse *)
           amrex::Vector<long,_std::allocator<long>_>::size
                     ((Vector<long,_std::allocator<long>_> *)0xe38401);
      pTVar6 = amrex::
               Vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
               ::operator[]((Vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                             *)in_stack_fffffffffffff770,(size_type)in_stack_fffffffffffff768);
      pTVar6->offset_size = (long)in_stack_fffffffffffff780;
      local_6d4 = 0;
      while( true ) {
        in_stack_fffffffffffff770 = (Print *)(long)local_6d4;
        pTVar6 = amrex::
                 Vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                 ::operator[]((Vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                               *)in_stack_fffffffffffff770,(size_type)in_stack_fffffffffffff768);
        if (pTVar6->offset_size <= (long)in_stack_fffffffffffff770) break;
        pTVar6 = amrex::
                 Vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                 ::operator[]((Vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                               *)in_stack_fffffffffffff770,(size_type)in_stack_fffffffffffff768);
        std::istream::operator>>(local_630,pTVar6->offset + local_6d4);
        local_6d4 = local_6d4 + 1;
      }
      std::ifstream::close();
      std::ifstream::~ifstream(local_630);
      std::__cxx11::string::~string(local_428);
      amrex::Vector<double,_std::allocator<double>_>::~Vector
                ((Vector<double,_std::allocator<double>_> *)0xe384e7);
      std::__cxx11::string::~string(local_258);
    }
    this->turbinflow_initialized = true;
    amrex::ParmParse::~ParmParse((ParmParse *)0xe38545);
  }
  amrex::
  Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~Vector((Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)0xe38577);
  amrex::ParmParse::~ParmParse((ParmParse *)0xe38584);
  return extraout_EAX;
}

Assistant:

void
TurbInflow::init(amrex::Geometry const& /*geom*/)
{
  amrex::ParmParse ppr;

  int n_tp = 0;
  n_tp = ppr.countval("turbinflows");
  amrex::Vector<std::string> tp_list;
  if (n_tp > 0) {
    tp.resize(n_tp);
    tp_list.resize(n_tp);
    for (int n = 0; n < n_tp; n++) {
      ppr.get("turbinflows", tp_list[n], n);
    }
  }

  for (int n = 0; n < n_tp; n++) {

    amrex::ParmParse pp("turbinflow." + tp_list[n]);
    if (pp.countval("turb_file") > 0) {

      // Query data
      pp.query("turb_file", tp[n].m_turb_file);
      tp[n].dir = -1;
      pp.query("dir", tp[n].dir);
      AMREX_ASSERT_WITH_MESSAGE(
        tp[n].dir >= 0 && tp[n].dir < AMREX_SPACEDIM,
        "Injection direction is needed: 0, 1 or 2");
      std::string side;
      pp.query("side", side);
      if (side == "low") {
        tp[n].side = amrex::Orientation::low;
      } else if (side == "high") {
        tp[n].side = amrex::Orientation::high;
      } else {
        amrex::Abort("turbinflow.side can only be low or high");
      }
      pp.query("time_offset", tp[n].time_shift);
      pp.query("turb_scale_loc", tp[n].turb_scale_loc);
      pp.query("turb_scale_vel", tp[n].turb_scale_vel);
      amrex::Print() << "Initializing turbInflow " << tp_list[n]
                     << " with file " << tp[n].m_turb_file
                     << " (location coordinates in will be scaled by "
                     << tp[n].turb_scale_loc
                     << " and velocity out to be scaled by "
                     << tp[n].turb_scale_vel << ") \n";

      // Get the turbcenter on the injection face
      amrex::Vector<amrex::Real> turb_center(AMREX_SPACEDIM - 1, 0);
      pp.getarr("turb_center", turb_center);
      AMREX_ASSERT_WITH_MESSAGE(
        turb_center.size() == AMREX_SPACEDIM - 1,
        "turb_center must have AMREX_SPACEDIM-1 elements");
      for (int idim = 0; idim < turb_center.size(); ++idim) {
        turb_center[idim] *= tp[n].turb_scale_loc;
      }

      pp.query("turb_nplane", tp[n].nplane);
      AMREX_ASSERT(tp[n].nplane > 0);
      pp.query("turb_conv_vel", tp[n].turb_conv_vel);
      AMREX_ASSERT(tp[n].turb_conv_vel > 0);

      // Set other stuff
      std::string turb_header = tp[n].m_turb_file + "/HDR";
      std::ifstream is(turb_header.c_str());
      if (!is.is_open()) {
        amrex::Abort("Unable to open input file " + turb_header);
      }
      amrex::Array<int, AMREX_SPACEDIM> npts = {{0}};
      amrex::Array<amrex::Real, AMREX_SPACEDIM> probsize = {{0}};
      amrex::Array<int, AMREX_SPACEDIM> iper = {{0}};
      is >> npts[0] >> npts[1] >> npts[2];
      is >> probsize[0] >> probsize[1] >> probsize[2];
      is >> iper[0] >> iper[1] >>
        iper[2]; // Unused - we assume it is always fully periodic

      for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
        tp[n].dx[idim] = probsize[idim] / amrex::Real(npts[idim] - 1);
        tp[n].dxinv[idim] = 1.0 / tp[n].dx[idim];
      }

      // The following is relative to the injection face:
      // 0 and 1 are transverse directions, 2 is normal
      // one ghost point on each side, tangential to inflow face
      tp[n].pboxsize[0] = probsize[0] - 2.0 * tp[n].dx[0];
      tp[n].pboxsize[1] = probsize[1] - 2.0 * tp[n].dx[1];
      tp[n].pboxsize[2] = probsize[2];

      tp[n].npboxcells[0] = npts[0] - 3;
      tp[n].npboxcells[1] = npts[1] - 3;
      tp[n].npboxcells[2] = npts[2];

      // Center the turbulence
      tp[n].pboxlo[0] = turb_center[0] - 0.5 * tp[n].pboxsize[0];
      tp[n].pboxlo[1] = turb_center[1] - 0.5 * tp[n].pboxsize[1];
      tp[n].pboxlo[2] = 0.;

      amrex::Box sbx(
        amrex::IntVect(AMREX_D_DECL(1, 1, 1)),
        amrex::IntVect(AMREX_D_DECL(npts[0], npts[1], tp[n].nplane)));

      tp[n].sdata = new amrex::FArrayBox(sbx, 3, amrex::The_Async_Arena());

      tp[n].kmax = npts[2];

      if (tp[n].isswirltype) {
        for (int i = 0; i < tp[n].kmax; i++) {
          amrex::Real rdummy = 0.0;
          is >> rdummy; // Time for each plane - unused at the moment
        }
      }

      // Offset for each plane in Binary TurbFile
      tp[n].m_offset.resize(tp[n].kmax * AMREX_SPACEDIM);
      tp[n].offset = tp[n].m_offset.data();
      tp[n].offset_size = tp[n].m_offset.size();
      for (int i = 0; i < tp[n].offset_size; i++) {
        is >> tp[n].offset[i];
      }
      is.close();
    }
    turbinflow_initialized = true;
  }
}